

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

ON_SimpleArray<ON_LinetypeSegment> * __thiscall
ON_SimpleArray<ON_LinetypeSegment>::operator=
          (ON_SimpleArray<ON_LinetypeSegment> *this,ON_SimpleArray<ON_LinetypeSegment> *src)

{
  ON_SimpleArray<ON_LinetypeSegment> *src_local;
  ON_SimpleArray<ON_LinetypeSegment> *this_local;
  
  if (this != src) {
    if (src->m_count < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < src->m_count) {
        SetCapacity(this,(long)src->m_count);
      }
      if (this->m_a != (ON_LinetypeSegment *)0x0) {
        this->m_count = src->m_count;
        memcpy(this->m_a,src->m_a,(long)this->m_count << 4);
      }
    }
  }
  return this;
}

Assistant:

ON_SimpleArray<T>& ON_SimpleArray<T>::operator=( const ON_SimpleArray<T>& src )
{
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        memcpy( (void*)(m_a), (void*)(src.m_a), m_count*sizeof(T) );
      }
    }
  }  
  return *this;
}